

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getOverflowPage(BtShared *pBt,Pgno ovfl,MemPage **ppPage,Pgno *pPgnoNext)

{
  uint uVar1;
  Pgno PVar2;
  int iVar3;
  uint uVar4;
  Pgno PVar5;
  Pgno key;
  long in_FS_OFFSET;
  u8 eType;
  Pgno pgno;
  MemPage *pPage;
  u8 local_45;
  Pgno local_44;
  MemPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (MemPage *)0x0;
  if (pBt->autoVacuum == '\0') {
    PVar5 = 0;
    PVar2 = 0;
  }
  else {
    local_44 = 0xaaaaaaaa;
    local_45 = 0xaa;
    PVar5 = ovfl;
    do {
      uVar4 = PVar5;
      PVar5 = uVar4 + 1;
      uVar1 = 0;
      if (1 < PVar5) {
        iVar3 = (uVar4 - 1) - (uVar4 - 1) % (pBt->usableSize / 5 + 1);
        uVar1 = iVar3 + (uint)(iVar3 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
      }
    } while ((PVar5 == uVar1) || (uVar4 == (uint)sqlite3PendingByte / pBt->pageSize));
    key = uVar4 + 1;
    PVar5 = 0;
    if (pBt->nPage < key) {
      PVar2 = 0;
    }
    else {
      PVar2 = ptrmapGet(pBt,key,&local_45,&local_44);
      if ((PVar2 == 0) && (local_45 == '\x04')) {
        PVar5 = key;
        if (local_44 != ovfl) {
          PVar5 = 0;
        }
        PVar2 = 0x65;
        if (local_44 != ovfl) {
          PVar2 = 0;
        }
      }
    }
  }
  if ((PVar2 == 0) &&
     (PVar2 = btreeGetPage(pBt,ovfl,&local_40,(uint)(ppPage == (MemPage **)0x0) * 2), PVar2 == 0)) {
    uVar1 = *(uint *)local_40->aData;
    PVar5 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    PVar2 = 0;
  }
  *pPgnoNext = PVar5;
  if (ppPage == (MemPage **)0x0) {
    if (local_40 != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_40->pDbPage);
    }
  }
  else {
    *ppPage = local_40;
  }
  PVar5 = 0;
  if (PVar2 != 0x65) {
    PVar5 = PVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return PVar5;
}

Assistant:

static int getOverflowPage(
  BtShared *pBt,               /* The database file */
  Pgno ovfl,                   /* Current overflow page number */
  MemPage **ppPage,            /* OUT: MemPage handle (may be NULL) */
  Pgno *pPgnoNext              /* OUT: Next overflow page number */
){
  Pgno next = 0;
  MemPage *pPage = 0;
  int rc = SQLITE_OK;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert(pPgnoNext);

#ifndef SQLITE_OMIT_AUTOVACUUM
  /* Try to find the next page in the overflow list using the
  ** autovacuum pointer-map pages. Guess that the next page in
  ** the overflow list is page number (ovfl+1). If that guess turns
  ** out to be wrong, fall back to loading the data of page
  ** number ovfl to determine the next page number.
  */
  if( pBt->autoVacuum ){
    Pgno pgno;
    Pgno iGuess = ovfl+1;
    u8 eType;

    while( PTRMAP_ISPAGE(pBt, iGuess) || iGuess==PENDING_BYTE_PAGE(pBt) ){
      iGuess++;
    }

    if( iGuess<=btreePagecount(pBt) ){
      rc = ptrmapGet(pBt, iGuess, &eType, &pgno);
      if( rc==SQLITE_OK && eType==PTRMAP_OVERFLOW2 && pgno==ovfl ){
        next = iGuess;
        rc = SQLITE_DONE;
      }
    }
  }
#endif

  assert( next==0 || rc==SQLITE_DONE );
  if( rc==SQLITE_OK ){
    rc = btreeGetPage(pBt, ovfl, &pPage, (ppPage==0) ? PAGER_GET_READONLY : 0);
    assert( rc==SQLITE_OK || pPage==0 );
    if( rc==SQLITE_OK ){
      next = get4byte(pPage->aData);
    }
  }

  *pPgnoNext = next;
  if( ppPage ){
    *ppPage = pPage;
  }else{
    releasePage(pPage);
  }
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}